

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMDisassembler.c
# Opt level: O0

DecodeStatus DecoderGPRRegisterClass(MCInst *Inst,uint RegNo,uint64_t Address,void *Decoder)

{
  DecodeStatus In;
  void *in_RCX;
  uint64_t in_RDX;
  uint in_ESI;
  MCInst *in_RDI;
  DecodeStatus S;
  DecodeStatus local_24;
  
  local_24 = MCDisassembler_Success;
  if ((in_ESI == 0xd) || (in_ESI == 0xf)) {
    local_24 = MCDisassembler_SoftFail;
  }
  In = DecodeGPRRegisterClass(in_RDI,in_ESI,in_RDX,in_RCX);
  Check(&local_24,In);
  return local_24;
}

Assistant:

static DecodeStatus DecoderGPRRegisterClass(MCInst *Inst, unsigned RegNo,
		uint64_t Address, const void *Decoder)
{
	DecodeStatus S = MCDisassembler_Success;
	if (RegNo == 13 || RegNo == 15)
		S = MCDisassembler_SoftFail;
	Check(&S, DecodeGPRRegisterClass(Inst, RegNo, Address, Decoder));
	return S;
}